

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstack.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int __status;
  exception *ex;
  int rc;
  sigaction sa;
  Context local_d8 [8];
  Context context;
  char **argv_local;
  int argc_local;
  
  pstack::Context::Context(local_d8);
  sa.sa_mask.__val[0xe] = 0;
  sa.sa_mask.__val[0xf] = 0;
  sa.sa_mask.__val[0xc] = 0;
  sa.sa_mask.__val[0xd] = 0;
  sa.sa_mask.__val[10] = 0;
  sa.sa_mask.__val[0xb] = 0;
  sa.sa_mask.__val[8] = 0;
  sa.sa_mask.__val[9] = 0;
  sa.sa_mask.__val[6] = 0;
  sa.sa_mask.__val[7] = 0;
  sa.sa_mask.__val[4] = 0;
  sa.sa_mask.__val[5] = 0;
  sa.sa_mask.__val[2] = 0;
  sa.sa_mask.__val[3] = 0;
  sa.sa_mask.__val[0] = 0;
  sa.sa_mask.__val[1] = 0;
  _rc = (__sighandler_t)0x0;
  sa.__sigaction_handler.sa_handler = (__sighandler_t)0x0;
  sa.sa_flags = 0;
  sa._140_4_ = 0;
  _rc = (__sighandler_t)main::$_0::operator_cast_to_function_pointer((__0 *)((long)&ex + 7));
  sa.sa_mask.__val[0xf] = CONCAT44(sa.sa_mask.__val[0xf]._4_4_,0x80000000);
  sigaction(2,(sigaction *)&rc,(sigaction *)0x0);
  __status = anon_unknown.dwarf_18341::emain(argc,argv,local_d8);
  ex._0_4_ = __status;
  if (((anonymous_namespace)::freeres & 1) == 0) {
    exit(__status);
  }
  pstack::Context::~Context(local_d8);
  return __status;
}

Assistant:

int
main(int argc, char **argv)
{
    try {
        Context context;
        struct sigaction sa;
        memset(&sa, 0, sizeof sa);
        sa.sa_handler = [](int) { interrupted = true; };
        // Only interrupt cleanly once. Then just terminate, in case we're stuck in a loop
        sa.sa_flags = SA_RESETHAND;
        sigaction(SIGINT, &sa, nullptr);
        int rc = emain(argc, argv, context);

        // Normally, exit without free'ing imagecache - don't waste effort
        // moving pointers around in a terminating process
        if (!freeres)
           exit(rc);
        return rc;
    }
    catch (std::exception &ex) {
        std::clog << "error: " << ex.what() << std::endl;
        return EX_SOFTWARE;
    }
}